

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O3

double * inform_local_predictive_info
                   (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,double *pi,
                   inform_error *err)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  _Bool _Var6;
  int iVar7;
  double *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  void *pvVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int *local_78;
  
  _Var6 = check_arguments(series,n,m,b,kpast,kfuture,err);
  if (_Var6) {
    return (double *)0x0;
  }
  uVar1 = kpast + kfuture;
  lVar20 = ((m - uVar1) + 1) * n;
  __ptr = pi;
  if ((pi != (double *)0x0) || (__ptr = (double *)malloc(lVar20 * 8), __ptr != (double *)0x0)) {
    auVar25._8_4_ = (int)(kpast >> 0x20);
    auVar25._0_8_ = kpast;
    auVar25._12_4_ = 0x45300000;
    dVar22 = pow((double)b,
                 (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
    uVar21 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
    auVar23._8_4_ = (int)(kfuture >> 0x20);
    auVar23._0_8_ = kfuture;
    auVar23._12_4_ = 0x45300000;
    dVar22 = pow((double)b,
                 (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
    uVar10 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
    lVar17 = uVar10 * uVar21;
    __ptr_00 = (double *)calloc(uVar10 + uVar21 + lVar17,4);
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (pi != (double *)0x0) goto LAB_00107344;
    }
    else {
      __ptr_01 = malloc(lVar20 * 0xc);
      if (__ptr_01 != (void *)0x0) {
        if (n != 0) {
          lVar5 = uVar21 * 4 + lVar17 * 4;
          piVar2 = (int *)((long)__ptr_01 + lVar20 * 4);
          piVar8 = series + kpast;
          local_78 = series + uVar1;
          sVar13 = 0;
          pvVar14 = __ptr_01;
          piVar15 = piVar2;
          piVar16 = piVar2 + lVar20;
          do {
            *piVar15 = 0;
            iVar7 = 1;
            iVar9 = 1;
            if (kpast != 0) {
              iVar11 = 0;
              sVar18 = 0;
              do {
                iVar9 = iVar9 * b;
                iVar11 = iVar11 * b + series[sVar18];
                sVar18 = sVar18 + 1;
              } while (kpast != sVar18);
              *piVar15 = iVar11;
            }
            *piVar16 = 0;
            if (kpast < uVar1) {
              iVar7 = 1;
              sVar18 = 0;
              iVar11 = 0;
              do {
                iVar7 = iVar7 * b;
                iVar11 = iVar11 * b + piVar8[sVar18];
                sVar18 = sVar18 + 1;
              } while (kfuture != sVar18);
              *piVar16 = iVar11;
            }
            lVar12 = 0;
            do {
              lVar19 = (long)piVar16[lVar12] + (long)iVar7 * (long)piVar15[lVar12];
              *(int *)((long)pvVar14 + lVar12 * 4) = (int)lVar19;
              piVar3 = (int *)((long)__ptr_00 + lVar19 * 4);
              *piVar3 = *piVar3 + 1;
              iVar11 = piVar15[lVar12];
              piVar3 = (int *)((long)__ptr_00 + (long)iVar11 * 4 + lVar17 * 4);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)((long)__ptr_00 + (long)piVar16[lVar12] * 4 + lVar5);
              *piVar3 = *piVar3 + 1;
              if ((uVar1 - m) + lVar12 != 0) {
                iVar4 = piVar8[lVar12];
                piVar15[lVar12 + 1] = (iVar11 * b + iVar4) - series[lVar12] * iVar9;
                piVar16[lVar12 + 1] = (piVar16[lVar12] * b - iVar4 * iVar7) + local_78[lVar12];
              }
              lVar19 = uVar1 + lVar12;
              lVar12 = lVar12 + 1;
            } while (lVar19 + 1U <= m);
            piVar15 = piVar15 + ((m + 1) - uVar1);
            piVar16 = piVar16 + ((m + 1) - uVar1);
            sVar13 = sVar13 + 1;
            series = series + m;
            piVar8 = piVar8 + m;
            local_78 = local_78 + m;
            pvVar14 = (void *)((long)pvVar14 + m * 4 + uVar1 * -4 + 4);
          } while (sVar13 != n);
          if (lVar20 != 0) {
            auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)lVar20);
            auVar24._8_4_ = (int)((ulong)lVar20 >> 0x20);
            auVar24._12_4_ = 0x45300000;
            lVar12 = 0;
            do {
              dVar22 = log2(((double)*(uint *)((long)__ptr_00 +
                                              (long)*(int *)((long)__ptr_01 + lVar12 * 4) * 4) *
                            ((auVar24._8_8_ - 1.9342813113834067e+25) +
                            (auVar24._0_8_ - 4503599627370496.0))) /
                            ((double)*(uint *)((long)__ptr_00 +
                                              (long)(piVar2 + lVar20)[lVar12] * 4 + lVar5) *
                            (double)*(uint *)((long)__ptr_00 + (long)piVar2[lVar12] * 4 + lVar17 * 4
                                             )));
              __ptr[lVar12] = dVar22;
              lVar12 = lVar12 + 1;
            } while (lVar20 != lVar12);
          }
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (pi == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_00107344:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_predictive_info(int const *series, size_t n, size_t m,
    int b, size_t kpast, size_t kfuture, double *pi, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NULL;

    size_t const N = n * (m - kpast - kfuture + 1);

    bool allocate_pi = (pi == NULL);
    if (allocate_pi)
    {
        pi = malloc(N * sizeof(double));
        if (pi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_pi) free(pi);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_pi) free(pi);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures, state, history, future);

    double s, h, f;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        f = futures.histogram[future[i]];
        pi[i] = log2((s * N) / (h * f));
    }

    free(state_data);
    free(histogram_data);

    return pi;
}